

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false>::
SetPropertyWithAttributes
          (SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> *this,
          DynamicObject *instance,PropertyId propertyId,Var value,PropertyAttributes attributes,
          PropertyValueInfo *info,PropertyOperationFlags flags,SideEffects possibleSideEffects)

{
  int *piVar1;
  Type *pTVar2;
  RecyclerWeakReference<Js::DynamicObject> *pRVar3;
  long lVar4;
  code *pcVar5;
  PropertyRecord *this_00;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *this_01;
  uint uVar6;
  bool bVar7;
  byte bVar8;
  PropertyAttributes PVar9;
  byte bVar10;
  uint32 index;
  int iVar11;
  BOOL BVar12;
  PropertyId propertyId_00;
  undefined4 *puVar13;
  PropertyRecord **ppPVar14;
  DictionaryTypeHandlerBase<unsigned_short> *pDVar15;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> *this_02;
  unsigned_short uVar16;
  ScriptContext *this_03;
  undefined7 in_register_00000081;
  PropertyRecord *local_68;
  PropertyRecord *propertyRecord;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *local_58;
  int i;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *descriptor;
  PropertyValueInfo *local_40;
  uint local_34;
  
  descriptor._4_4_ = (uint)CONCAT71(in_register_00000081,attributes);
  local_34 = propertyId;
  if (instance == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    local_40 = (PropertyValueInfo *)instance;
    Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar13 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x92a,"(instance)","instance");
    if (!bVar7) goto LAB_00dd3c57;
    *puVar13 = 0;
    instance = (DynamicObject *)local_40;
  }
  this_03 = *(ScriptContext **)
             (*(long *)(*(long *)&((PropertyValueInfo *)instance)->m_propertyIndex + 8) + 0x490);
  propertyRecord = (PropertyRecord *)this_03;
  if (local_34 == 0xffffffff) {
    AssertCount = AssertCount + 1;
    local_40 = info;
    Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar13 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x92f,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar7) goto LAB_00dd3c57;
    *puVar13 = 0;
    this_03 = *(ScriptContext **)
               (*(long *)(*(long *)&((PropertyValueInfo *)instance)->m_propertyIndex + 8) + 0x490);
    info = local_40;
  }
  local_68 = ScriptContext::GetPropertyName(this_03,local_34);
  bVar7 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                      *)(this->propertyMap).ptr,&local_68,
                     (SimpleDictionaryPropertyDescriptor<unsigned_short> **)&i,(int *)&local_58);
  uVar6 = descriptor._4_4_;
  if (!bVar7) {
    if (local_68->isNumeric != true) {
      BVar12 = SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>::
               AddProperty<Js::PropertyRecord_const*>
                         ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>
                           *)this,instance,local_68,value,descriptor._4_1_,info,flags,
                          possibleSideEffects);
      return BVar12;
    }
    index = PropertyRecord::GetNumericValue(local_68);
    BVar12 = DynamicTypeHandler::SetItemWithAttributes
                       (&this->super_DynamicTypeHandler,instance,index,value,descriptor._4_1_);
    return BVar12;
  }
  bVar8 = _i->Attributes;
  if ((bVar8 & 0x10) != (descriptor._4_1_ & 0x10)) {
    pDVar15 = SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>::
              ConvertToTypeHandler<Js::DictionaryTypeHandlerBase<unsigned_short>,Js::PropertyRecord_const*>
                        ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>
                          *)this,instance);
    piVar1 = (int *)(*(long *)(*(long *)(*(long *)&((PropertyValueInfo *)instance)->m_propertyIndex
                                        + 8) + 0x490) + 0x614);
    *piVar1 = *piVar1 + 1;
    iVar11 = (*(pDVar15->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x3a])
                       (pDVar15,instance,(ulong)local_34,value,(ulong)(uVar6 & 0xff),info,
                        (ulong)flags,(ulong)possibleSideEffects);
    return iVar11;
  }
  if ((bVar8 & 0x18) == 8) {
    bVar8 = (this->super_DynamicTypeHandler).flags;
    if ((bVar8 & 4) != 0) goto LAB_00dd3918;
    if (*(char *)(*(long *)&((PropertyValueInfo *)instance)->m_propertyIndex + 0x30) == '\x01') {
      if (((bVar8 & 0x10) != 0) ||
         (*(char *)(*(long *)&((PropertyValueInfo *)instance)->m_propertyIndex + 0x31) == '\x01')) {
        AssertCount = AssertCount + 1;
        local_40 = (PropertyValueInfo *)instance;
        Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar13 = 1;
        bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x960,
                                    "(!GetIsShared() && !instance->GetDynamicType()->GetIsShared())"
                                    ,"!GetIsShared() && !instance->GetDynamicType()->GetIsShared()")
        ;
        if (!bVar7) goto LAB_00dd3c57;
        *puVar13 = 0;
        instance = (DynamicObject *)local_40;
      }
      DynamicObject::ChangeType(instance);
    }
    if (((this->field_0x28 & 2) != 0) &&
       (bVar7 = SimpleDictionaryUnorderedTypeHandler<unsigned_short,_const_Js::PropertyRecord_*,_false>
                ::TryUndeleteProperty
                          ((SimpleDictionaryUnorderedTypeHandler<unsigned_short,_const_Js::PropertyRecord_*,_false>
                            *)this,instance,_i->propertyIndex,(unsigned_short *)&local_58), bVar7))
    {
      ppPVar14 = JsUtil::
                 BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
                 ::GetKeyAt((this->propertyMap).ptr,(uint)(ushort)local_58);
      if (*ppPVar14 != local_68) {
        AssertCount = AssertCount + 1;
        local_40 = (PropertyValueInfo *)instance;
        Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar13 = 1;
        bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x96b,
                                    "(PropertyRecordStringHashComparer<TMapKey>::Equals(propertyMap->GetKeyAt(propertyIndex), propertyRecord))"
                                    ,
                                    "PropertyRecordStringHashComparer<TMapKey>::Equals(propertyMap->GetKeyAt(propertyIndex), propertyRecord)"
                                   );
        if (!bVar7) goto LAB_00dd3c57;
        *puVar13 = 0;
        instance = (DynamicObject *)local_40;
      }
      _i = JsUtil::
           BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
           ::GetReferenceAt((this->propertyMap).ptr,(uint)(ushort)local_58);
    }
    bVar7 = SupportsSwitchingToUnordered(this,(ScriptContext *)propertyRecord);
    if (bVar7) {
      this->numDeletedProperties = this->numDeletedProperties + 0xff;
    }
    ScriptContext::InvalidateProtoCaches((ScriptContext *)propertyRecord,local_34);
    _i->Attributes = '\a';
    bVar8 = 7;
  }
  if (bVar8 != descriptor._4_1_) {
    bVar8 = (this->super_DynamicTypeHandler).flags;
    if ((bVar8 & 4) != 0) {
LAB_00dd3918:
      this_02 = ConvertToNonSharedSimpleDictionaryType(this,instance);
      BVar12 = SetPropertyWithAttributes
                         (this_02,instance,local_34,value,descriptor._4_1_,info,flags,
                          possibleSideEffects);
      return BVar12;
    }
    pTVar2 = ((Type *)&((PropertyValueInfo *)instance)->m_propertyIndex)->ptr;
    if (*(char *)&pTVar2[1].javascriptLibrary.ptr == '\x01') {
      if (((bVar8 & 0x10) != 0) ||
         (*(undefined1 *)((long)&pTVar2[1].javascriptLibrary.ptr + 1) == '\x01')) {
        AssertCount = AssertCount + 1;
        local_40 = (PropertyValueInfo *)instance;
        Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar13 = 1;
        bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x997,
                                    "(!GetIsShared() && !instance->GetDynamicType()->GetIsShared())"
                                    ,"!GetIsShared() && !instance->GetDynamicType()->GetIsShared()")
        ;
        if (!bVar7) goto LAB_00dd3c57;
        *puVar13 = 0;
        instance = (DynamicObject *)local_40;
      }
      DynamicObject::ChangeType(instance);
    }
    _i->Attributes = (PropertyAttributes)descriptor._4_4_;
  }
  if (_i->propertyIndex == 0xffff) goto LAB_00dd3b6f;
  pRVar3 = (this->singletonInstance).ptr;
  if (pRVar3 == (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
    bVar7 = false;
  }
  else if ((PropertyValueInfo *)(pRVar3->super_RecyclerWeakReferenceBase).strongRef ==
           (PropertyValueInfo *)instance) {
    bVar7 = true;
  }
  else {
    AssertCount = AssertCount + 1;
    local_40 = info;
    Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar13 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x9a5,
                                "(this->singletonInstance == nullptr || localSingletonInstance == instance)"
                                ,
                                "this->singletonInstance == nullptr || localSingletonInstance == instance"
                               );
    if (!bVar7) goto LAB_00dd3c57;
    *puVar13 = 0;
    bVar7 = false;
    info = local_40;
  }
  if ((*(byte *)_i & 2) == 0) {
    if ((((flags & PropertyOperation_PreInit) == PropertyOperation_None) &&
        (*(byte *)_i = *(byte *)_i | 2, bVar7)) &&
       ((flags & (PropertyOperation_NonFixedValue|PropertyOperation_SpecialValue)) ==
        PropertyOperation_None && 0xf < local_34)) {
      local_40 = info;
      if (((this->super_DynamicTypeHandler).flags & 0x10) != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar13 = 1;
        bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x9af,"(!GetIsShared())","!GetIsShared()");
        if (!bVar7) goto LAB_00dd3c57;
        *puVar13 = 0;
      }
      if (value == (Var)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar13 = 1;
        bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x9b0,"(value != nullptr)","value != nullptr");
        if (!bVar7) goto LAB_00dd3c57;
        *puVar13 = 0;
      }
      BVar12 = RecyclableObject::IsExternal(&instance->super_RecyclableObject);
      if (BVar12 != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar13 = 1;
        bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x9b2,"(!instance->IsExternal())","!instance->IsExternal()");
        if (!bVar7) {
LAB_00dd3c57:
          pcVar5 = (code *)invalidInstructionException();
          (*pcVar5)();
        }
        *puVar13 = 0;
      }
      bVar7 = VarIs<Js::JavascriptFunction>(value);
      if (bVar7) {
        bVar7 = Phases::IsEnabled((Phases *)&DAT_015a4e90,FixMethodPropsPhase);
        bVar8 = *(byte *)_i;
        if (bVar7) {
LAB_00dd3c21:
          bVar10 = 0;
        }
        else {
LAB_00dd3c45:
          bVar10 = 4;
        }
      }
      else {
        bVar7 = Phases::IsEnabled((Phases *)&DAT_015a4e90,FixDataPropsPhase);
        if (bVar7) {
          bVar8 = *(byte *)_i;
          goto LAB_00dd3c21;
        }
        bVar7 = DynamicTypeHandler::CheckHeuristicsForFixedDataProps(instance,local_34,value);
        bVar8 = *(byte *)_i;
        if (bVar7) goto LAB_00dd3c45;
        bVar10 = 0;
      }
      *(byte *)_i = bVar8 & 0xfb | bVar10;
      info = local_40;
    }
  }
  else {
    SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>::
    InvalidateFixedField<Js::PropertyRecord_const*>
              ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false> *)
               this,local_68,_i,
               *(ScriptContext **)
                (*(long *)(*(long *)&((PropertyValueInfo *)instance)->m_propertyIndex + 8) + 0x490))
    ;
  }
  DynamicTypeHandler::SetSlotUnchecked(instance,(uint)_i->propertyIndex,value);
  if (((uint)*_i & 6) == 2) {
    if (info == (PropertyValueInfo *)0x0) goto LAB_00dd3b6f;
    PVar9 = _i->Attributes;
    uVar16 = _i->propertyIndex;
  }
  else {
    if (info == (PropertyValueInfo *)0x0) goto LAB_00dd3b6f;
    uVar16 = 0xffff;
    PVar9 = '\0';
  }
  (((RecyclableObject *)&info->m_instance)->super_FinalizableObject).super_IRecyclerVisitedObject.
  _vptr_IRecyclerVisitedObject = (_func_int **)instance;
  *(unsigned_short *)&((Type *)&info->m_propertyIndex)->ptr = uVar16;
  info->m_attributes = PVar9;
  info->flags = InlineCacheNoFlags;
LAB_00dd3b6f:
  if ((_i->Attributes & 1) != 0) {
    DynamicObject::SetHasNoEnumerableProperties(instance,false);
  }
  lVar4 = *(long *)(*(long *)&((PropertyValueInfo *)instance)->m_propertyIndex + 8);
  Memory::Recycler::WBSetBit((char *)&local_58);
  local_58 = (PrototypeChainCache<Js::OnlyWritablePropertyCache> *)(lVar4 + 0x1d40);
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_58);
  this_01 = local_58;
  if (((_i->Attributes & 4) == 0) &&
     (DynamicTypeHandler::SetHasOnlyWritableDataProperties(&this->super_DynamicTypeHandler,false),
     this_00 = propertyRecord, ((this->super_DynamicTypeHandler).flags & 0x20) != 0)) {
    propertyId_00 =
         DynamicTypeHandler::TMapKey_GetPropertyId((ScriptContext *)propertyRecord,local_34);
    ScriptContext::InvalidateStoreFieldCaches((ScriptContext *)this_00,propertyId_00);
    PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear(this_01);
  }
  DynamicTypeHandler::SetPropertyUpdateSideEffect
            (&this->super_DynamicTypeHandler,instance,local_34,value,possibleSideEffects);
  return 1;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SetPropertyWithAttributes(DynamicObject* instance, PropertyId propertyId, Var value, PropertyAttributes attributes, PropertyValueInfo* info, PropertyOperationFlags flags, SideEffects possibleSideEffects)
    {
        AnalysisAssert(instance);
        SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
        ScriptContext* scriptContext = instance->GetScriptContext();
        bool throwIfNotExtensible = (flags & PropertyOperation_ThrowIfNotExtensible) != 0;

        Assert(propertyId != Constants::NoProperty);
        PropertyRecord const* propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);
        if (propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
            if ((attributes & PropertyLetConstGlobal) != (descriptor->Attributes & PropertyLetConstGlobal))
            {
                // We have a shadowing case here.  Either a let/const is being declared
                // that shadows an undeclared global property or an undeclared global
                // property is being added after a let/const was already declared.
                //
                // SimpleDictionaryTypeHandlerBase does not handle shadowed globals
                // because we do not want to add another property index field to the
                // property descriptors.  Instead convert to DictionaryTypeHandler
                // where it will reuse one of the getter/setter fields on its
                // property descriptor type.
                //
                // An exception is in the language service that will sometimes execute
                // the glo function twice causing a const or let appear to shadow itself.
                // In this case setting the property is also right.
                return
                    ConvertToDictionaryType(instance)
                        ->SetPropertyWithAttributes(
                                instance,
                                propertyId,
                                value,
                                attributes,
                                info,
                                flags,
                                possibleSideEffects);
            }

            if (descriptor->Attributes & PropertyDeleted && !(descriptor->Attributes & PropertyLetConstGlobal))
            {
                Assert((descriptor->Attributes & PropertyLetConstGlobal) == 0);
                if(GetIsLocked())
                {
                    return
                        ConvertToNonSharedSimpleDictionaryType(instance)
                            ->SetPropertyWithAttributes(
                                instance,
                                propertyId,
                                value,
                                attributes,
                                info,
                                flags,
                                possibleSideEffects);
                }
                else if (instance->GetDynamicType()->GetIsLocked())
                {
                    Assert(!GetIsShared() && !instance->GetDynamicType()->GetIsShared());

                    // We have changed the type of the only instance using this type handler, so we don't need to say the type handler is shared here.
                    instance->ChangeType();
                }

                if(isUnordered)
                {
                    TPropertyIndex propertyIndex;
                    if(AsUnordered()->TryUndeleteProperty(instance, descriptor->propertyIndex, &propertyIndex))
                    {
                        Assert(PropertyRecordStringHashComparer<TMapKey>::Equals(propertyMap->GetKeyAt(propertyIndex), propertyRecord));
                        descriptor = propertyMap->GetReferenceAt(propertyIndex);
                    }
                }

                if (IsNotExtensibleSupported)
                {
                    bool isForce = (flags & PropertyOperation_Force) != 0;
                    if (!isForce)
                    {
                        if (!this->VerifyIsExtensible(scriptContext, throwIfNotExtensible))
                        {
                            return FALSE;
                        }
                    }
                }

                if(SupportsSwitchingToUnordered(scriptContext))
                {
                    --numDeletedProperties;
                }
                scriptContext->InvalidateProtoCaches(propertyId);
                descriptor->Attributes = PropertyDynamicTypeDefaults;
            }

            if (descriptor->Attributes != attributes)
            {
                if (GetIsLocked())
                {
                    return
                        ConvertToNonSharedSimpleDictionaryType(instance)
                            ->SetPropertyWithAttributes(
                                instance,
                                propertyId,
                                value,
                                attributes,
                                info,
                                flags,
                                possibleSideEffects);
                }
                else
                {
                    if (instance->GetDynamicType()->GetIsLocked())
                    {
                        Assert(!GetIsShared() && !instance->GetDynamicType()->GetIsShared());

                        // We have changed the type of the only instance using this type handler, so we don't need to say the type handler is shared here.
                        instance->ChangeType();
                    }

                    descriptor->Attributes = attributes;
                }
            }

            if (descriptor->propertyIndex != NoSlots)
            {
#if ENABLE_FIXED_FIELDS
                DynamicObject* localSingletonInstance = this->singletonInstance != nullptr ? this->singletonInstance->Get() : nullptr;
                Assert(this->singletonInstance == nullptr || localSingletonInstance == instance);
                if (!descriptor->isInitialized)
                {
                    if ((flags & PropertyOperation_PreInit) == 0)
                    {
                        // Consider: It would be nice to assert the slot is actually null.  However, we sometimes pre-initialize to undefined or even
                        // some other special illegal value (for let or const), currently == null.
                        descriptor->isInitialized = true;
                        if (localSingletonInstance == instance && !IsInternalPropertyId(propertyId) && (flags & (PropertyOperation_SpecialValue | PropertyOperation_NonFixedValue)) == 0)
                        {
                            Assert(!GetIsShared());
                            Assert(value != nullptr);
                            // We don't want fixed properties on external objects.  See DynamicObject::ResetObject for more information.
                            Assert(!instance->IsExternal());
                            descriptor->isFixed = (VarIs<JavascriptFunction>(value) ? ShouldFixMethodProperties() : (ShouldFixDataProperties() && CheckHeuristicsForFixedDataProps(instance, propertyId, value)));
                        }
                    }
                }
                else
                {
                    InvalidateFixedField(propertyRecord, descriptor, instance->GetScriptContext());
                }
#endif
                SetSlotUnchecked(instance, descriptor->propertyIndex, value);

                if (!descriptor->IsOrMayBecomeFixed())
                {
                    SetPropertyValueInfoNonFixed(info, instance, descriptor->propertyIndex, descriptor->Attributes);
                }
                else
                {
                    PropertyValueInfo::SetNoCache(info, instance);
                }
            }

            if (descriptor->Attributes & PropertyEnumerable)
            {
                instance->SetHasNoEnumerableProperties(false);
            }

            instance->GetLibrary()->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(this, descriptor->Attributes, propertyId, scriptContext);

            SetPropertyUpdateSideEffect(instance, propertyId, value, possibleSideEffects);
            return true;
        }

        // Always check numeric propertyRecord. May create objectArray.
        if (propertyRecord->IsNumeric())
        {
            return SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SetItemWithAttributes(instance, propertyRecord->GetNumericValue(), value, attributes);
        }

        return this->AddProperty(instance, propertyRecord, value, attributes, info, flags, possibleSideEffects);
    }